

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::ClearField
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  ReflectionSchema *this_00;
  undefined8 uVar1;
  FieldDescriptor FVar2;
  string *default_value;
  long *plVar3;
  bool bVar4;
  uint32 uVar5;
  CppType CVar6;
  MapFieldBase *this_01;
  EnumValueDescriptor *pEVar7;
  undefined8 *puVar8;
  ulong uVar9;
  Arena *arena;
  undefined4 uVar10;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ClearField","Field does not match message type.");
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar5 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    ExtensionSet::ClearExtension
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5),
               *(int *)(field + 0x38));
    return;
  }
  if (*(int *)(field + 0x4c) == 3) {
    CVar6 = FieldDescriptor::cpp_type(field);
    switch(CVar6) {
    case CPPTYPE_INT32:
    case CPPTYPE_INT64:
    case CPPTYPE_UINT32:
    case CPPTYPE_UINT64:
    case CPPTYPE_DOUBLE:
    case CPPTYPE_FLOAT:
    case CPPTYPE_BOOL:
    case CPPTYPE_ENUM:
      uVar5 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
      *(undefined4 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) = 0;
      return;
    case CPPTYPE_STRING:
      uVar5 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedPtrFieldBase::
      Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                ((RepeatedPtrFieldBase *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5));
      return;
    case CPPTYPE_MESSAGE:
      goto switchD_00312e10_caseD_a;
    default:
      return;
    }
  }
  if (*(long *)(field + 0x60) != 0) {
    ClearOneofField(this,message,field);
    return;
  }
  bVar4 = HasBit(this,message,field);
  if (!bVar4) {
    return;
  }
  ClearBit(this,message,field);
  CVar6 = FieldDescriptor::cpp_type(field);
  switch(CVar6) {
  case CPPTYPE_INT32:
  case CPPTYPE_UINT32:
    uVar10 = *(undefined4 *)(field + 0xa0);
    goto LAB_00312f9b;
  case CPPTYPE_INT64:
  case CPPTYPE_UINT64:
    uVar1 = *(undefined8 *)(field + 0xa0);
    uVar5 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) = uVar1;
    break;
  case CPPTYPE_DOUBLE:
    uVar1 = *(undefined8 *)(field + 0xa0);
    uVar5 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) = uVar1;
    break;
  case CPPTYPE_FLOAT:
    uVar10 = *(undefined4 *)(field + 0xa0);
    uVar5 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(undefined4 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) = uVar10;
    break;
  case CPPTYPE_BOOL:
    FVar2 = field[0xa0];
    uVar5 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(FieldDescriptor *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) =
         FVar2;
    break;
  case CPPTYPE_ENUM:
    pEVar7 = FieldDescriptor::default_value_enum(field);
    uVar10 = *(undefined4 *)(pEVar7 + 0x10);
LAB_00312f9b:
    uVar5 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(undefined4 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) = uVar10;
    break;
  case CPPTYPE_STRING:
    puVar8 = (undefined8 *)ReflectionSchema::GetFieldDefault(&this->schema_,field);
    default_value = (string *)*puVar8;
    uVar5 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    arena = *(Arena **)
             ((long)&(message->super_MessageLite)._vptr_MessageLite +
             (ulong)(uint)(this->schema_).metadata_offset_);
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 8);
    }
    ArenaStringPtr::SetAllocated
              ((ArenaStringPtr *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5),default_value,
               (string *)0x0,arena);
    return;
  case CPPTYPE_MESSAGE:
    this_00 = &this->schema_;
    if ((this->schema_).has_bits_offset_ != -1) {
      uVar5 = ReflectionSchema::GetFieldOffset(this_00,field);
      (**(code **)(**(long **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5)
                  + 0x38))();
      return;
    }
    uVar9 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                      (ulong)(uint)(this->schema_).metadata_offset_);
    if ((uVar9 & 1) != 0) {
      uVar9 = *(ulong *)((uVar9 & 0xfffffffffffffffe) + 8);
    }
    if (uVar9 == 0) {
      uVar5 = ReflectionSchema::GetFieldOffset(this_00,field);
      plVar3 = *(long **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5);
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 8))();
      }
    }
    uVar5 = ReflectionSchema::GetFieldOffset(this_00,field);
    *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) = 0;
  }
  return;
switchD_00312e10_caseD_a:
  bVar4 = FieldDescriptor::is_map(field);
  uVar5 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
  this_01 = (MapFieldBase *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5);
  if (bVar4) {
    this_01 = (MapFieldBase *)MapFieldBase::MutableRepeatedField(this_01);
  }
  RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
            ((RepeatedPtrFieldBase *)this_01);
  return;
}

Assistant:

void GeneratedMessageReflection::ClearField(
    Message* message, const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(ClearField);

  if (field->is_extension()) {
    MutableExtensionSet(message)->ClearExtension(field->number());
  } else if (!field->is_repeated()) {
    if (field->containing_oneof()) {
      ClearOneofField(message, field);
      return;
    }
    if (HasBit(*message, field)) {
      ClearBit(message, field);

      // We need to set the field back to its default value.
      switch (field->cpp_type()) {
#define CLEAR_TYPE(CPPTYPE, TYPE)                                            \
        case FieldDescriptor::CPPTYPE_##CPPTYPE:                             \
          *MutableRaw<TYPE>(message, field) =                                \
            field->default_value_##TYPE();                                   \
          break;

        CLEAR_TYPE(INT32 , int32 );
        CLEAR_TYPE(INT64 , int64 );
        CLEAR_TYPE(UINT32, uint32);
        CLEAR_TYPE(UINT64, uint64);
        CLEAR_TYPE(FLOAT , float );
        CLEAR_TYPE(DOUBLE, double);
        CLEAR_TYPE(BOOL  , bool  );
#undef CLEAR_TYPE

        case FieldDescriptor::CPPTYPE_ENUM:
          *MutableRaw<int>(message, field) =
            field->default_value_enum()->number();
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING: {
              const string* default_ptr =
                  &DefaultRaw<ArenaStringPtr>(field).Get();
              MutableRaw<ArenaStringPtr>(message, field)->SetAllocated(
                  default_ptr, NULL, GetArena(message));
              break;
            }
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (!schema_.HasHasbits()) {
            // Proto3 does not have has-bits and we need to set a message field
            // to NULL in order to indicate its un-presence.
            if (GetArena(message) == NULL) {
              delete *MutableRaw<Message*>(message, field);
            }
            *MutableRaw<Message*>(message, field) = NULL;
          } else {
            (*MutableRaw<Message*>(message, field))->Clear();
          }
          break;
      }
    }
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
      case FieldDescriptor::CPPTYPE_##UPPERCASE :                             \
        MutableRaw<RepeatedField<LOWERCASE> >(message, field)->Clear();       \
        break

      HANDLE_TYPE( INT32,  int32);
      HANDLE_TYPE( INT64,  int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE( FLOAT,  float);
      HANDLE_TYPE(  BOOL,   bool);
      HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING: {
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            MutableRaw<RepeatedPtrField<string> >(message, field)->Clear();
            break;
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)
              ->MutableRepeatedField()
              ->Clear<GenericTypeHandler<Message> >();
        } else {
          // We don't know which subclass of RepeatedPtrFieldBase the type is,
          // so we use RepeatedPtrFieldBase directly.
          MutableRaw<RepeatedPtrFieldBase>(message, field)
              ->Clear<GenericTypeHandler<Message> >();
        }
        break;
      }
    }
  }
}